

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

bool __thiscall
Am_Rich_Text_Data::Calc_Line_Dim
          (Am_Rich_Text_Data *this,Am_Drawonable *inDrawonable,Am_Text_Index inStartIndex,
          unsigned_long inTargetWidth,Am_Text_Length *outCharsOnLine,unsigned_short *outAscent,
          unsigned_short *outDescent)

{
  ushort uVar1;
  Am_Text_Style_Run *inStyleRun;
  unsigned_long uVar2;
  ulong uVar3;
  EBreakTypes EVar4;
  Am_Rich_Text_Data *this_00;
  int iVar5;
  int iVar6;
  ulong inMaxChars;
  Am_Text_Style_Run *pAVar7;
  long lVar8;
  SStyleRunInfo local_a8;
  Am_Text_Length *local_88;
  ushort *local_80;
  unsigned_long local_78;
  Am_Text_Style_Run *local_70;
  ulong local_68;
  Am_Drawonable *local_60;
  ulong local_58;
  SBreakInfo local_50;
  Am_Text_Index relSRIndex;
  
  relSRIndex = 0;
  *outCharsOnLine = 0;
  *outAscent = 0;
  *outDescent = 0;
  local_88 = outCharsOnLine;
  local_80 = outAscent;
  local_78 = inTargetWidth;
  local_60 = inDrawonable;
  local_a8.end_frag = Get_Fragment_At(this,inStartIndex,&local_a8.end_frag_offset);
  inStyleRun = Get_Style_Run_At(this,inStartIndex,&relSRIndex);
  uVar2 = (inStyleRun->mCharsInRun - relSRIndex) + 1;
  local_68 = 0;
  do {
    Find_Next_Break(&local_50,local_a8.end_frag_offset,local_a8.end_frag);
    EVar4 = local_50.why;
    this_00 = (Am_Rich_Text_Data *)(ulong)local_50.why;
    local_58 = local_50.len;
    uVar3 = 0;
    lVar8 = 0;
    iVar6 = 0;
    iVar5 = 0;
    local_70 = inStyleRun;
    while (inMaxChars = local_58 - uVar3, pAVar7 = inStyleRun, uVar3 <= local_58 && inMaxChars != 0)
    {
      if (uVar2 <= inMaxChars) {
        inMaxChars = uVar2;
      }
      Calc_SR_Dim(&local_a8,this_00,local_60,inStyleRun,local_a8.end_frag,local_a8.end_frag_offset,
                  inMaxChars);
      lVar8 = lVar8 + local_a8.width_used;
      uVar3 = uVar3 + inMaxChars;
      uVar2 = uVar2 - inMaxChars;
      if (iVar6 < local_a8.ascent) {
        iVar6 = local_a8.ascent;
      }
      if (iVar5 < local_a8.descent) {
        iVar5 = local_a8.descent;
      }
      pAVar7 = local_70;
      if (EVar4 == EndOfText) break;
      if (uVar2 == 0) {
        inStyleRun = inStyleRun->mNext;
        if (inStyleRun == (Am_Text_Style_Run *)0x0) {
          Am_Error("Ran out of Style_Run info.");
        }
        uVar2 = inStyleRun->mCharsInRun;
      }
    }
    local_68 = local_68 + lVar8;
    if (local_78 < local_68) goto LAB_00247fa8;
    *local_88 = *local_88 + uVar3;
    uVar1 = *local_80;
    if ((int)(uint)uVar1 < iVar6) {
      uVar1 = (ushort)iVar6;
    }
    *local_80 = uVar1;
    uVar1 = *outDescent;
    if ((int)(uint)uVar1 < iVar5) {
      uVar1 = (ushort)iVar5;
    }
    *outDescent = uVar1;
    inStyleRun = pAVar7;
  } while (EVar4 != EndOfText);
  EVar4 = EndOfText;
LAB_00247fa8:
  return EVar4 == EndOfText;
}

Assistant:

bool
Am_Rich_Text_Data::Calc_Line_Dim(Am_Drawonable *inDrawonable,
                                 Am_Text_Index inStartIndex,
                                 unsigned long inTargetWidth,
                                 Am_Text_Length &outCharsOnLine,
                                 unsigned short &outAscent,
                                 unsigned short &outDescent)
{
  unsigned long cumChars = 0, cumWidth = 0;
  Am_Text_Index relSRIndex = 0, chars_rem_in_sr = 0;
  SBreakInfo break_info;
  SStyleRunInfo sr_info;

  outCharsOnLine = 0;
  outAscent = 0;
  outDescent = 0;

  sr_info.end_frag = Get_Fragment_At(inStartIndex, sr_info.end_frag_offset);
  Am_Text_Style_Run *curSR = Get_Style_Run_At(inStartIndex, relSRIndex);

  chars_rem_in_sr = curSR->Length() - relSRIndex + 1; // incl cur char too

  // COMMENT .....
  while (true) {
    break_info = Find_Next_Break(sr_info.end_frag_offset, sr_info.end_frag);

    // this loop calculates how many pixels are needed to print until
    // the next break. There may be more than one style run until that break

    Am_Text_Length break_chars_used = 0, max_chars = 0;
    unsigned long break_width_used = 0;
    int break_ascent = 0, break_descent = 0;

    // Continue stepping through the style runs, until having processed
    // break_info.len characters or used up more pixels than were remaining
    while (break_chars_used < break_info.len) {
      max_chars = min(break_info.len - break_chars_used, chars_rem_in_sr);

      sr_info = Calc_SR_Dim(inDrawonable, curSR, sr_info.end_frag,
                            sr_info.end_frag_offset, max_chars);

      // Update data about this break
      break_width_used += sr_info.width_used;
      break_chars_used += max_chars;
      chars_rem_in_sr -= max_chars;

      break_ascent = max(sr_info.ascent, break_ascent);
      break_descent = max(sr_info.descent, break_descent);

      if (break_info.why == EndOfText)
        break;

      // skip to next style run, since there should be more test remaining
      if (chars_rem_in_sr == 0) {
        curSR = curSR->Next();
        if (curSR == nullptr) {
          Am_Error("Ran out of Style_Run info.");
          // this should never happen... eventually throw an exception
        }
        chars_rem_in_sr = curSR->Length();
      }
    }

    if (cumWidth + break_width_used <= inTargetWidth) {
      outCharsOnLine += break_chars_used;

      outAscent = max(break_ascent, outAscent);
      outDescent = max(break_descent, outDescent);
      cumChars += break_chars_used;
      cumWidth += break_width_used;
    } else
      break;

    if (break_info.why == EndOfText)
      break;
  }

  return (break_info.why == EndOfText) ? true : false;
}